

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<unsigned_long> __thiscall wasm::WATParser::Lexer::takeOffset(Lexer *this)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  size_type sVar3;
  char *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  string_view sVar5;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  optional<unsigned_long> oVar6;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  string_view local_d8;
  undefined1 local_c8 [8];
  Lexer subLexer;
  anon_unknown_0 *local_48;
  char *local_40;
  undefined1 local_38 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> result;
  Lexer *this_local;
  optional<unsigned_long> o;
  
  result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._16_8_
       = this;
  sVar5 = next(this);
  local_48 = (anon_unknown_0 *)sVar5._M_len;
  local_40 = sVar5._M_str;
  sVar5._M_str = in_RCX;
  sVar5._M_len = (size_t)local_40;
  anon_unknown_0::keyword
            ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_38,local_48,sVar5)
  ;
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_38);
  if (bVar1) {
    pbVar2 = &std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator->
                        ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_38)->
              span;
    __x = std::basic_string_view<char,_std::char_traits<char>_>::substr(pbVar2,0,7);
    __y = sv("offset=",7);
    bVar1 = std::operator!=(__x,__y);
    if (bVar1) {
      std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
      uVar4 = extraout_RDX;
      goto LAB_0231df1f;
    }
    pbVar2 = &std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator->
                        ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_38)->
              span;
    local_d8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (pbVar2,7,0xffffffffffffffff);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    Lexer((Lexer *)local_c8,local_d8,&local_100);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_100);
    oVar6 = takeU64((Lexer *)local_c8);
    this_local = oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_payload;
    o.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
         oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
    if (bVar1) {
      pbVar2 = &std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator->
                          ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_38)
                ->span;
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar2);
      this->pos = this->pos + sVar3;
      advance(this);
    }
    ~Lexer((Lexer *)local_c8);
    uVar4 = extraout_RDX_00;
    if (bVar1) goto LAB_0231df1f;
  }
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
  uVar4 = extraout_RDX_01;
LAB_0231df1f:
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar4 >> 8);
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged =
       (bool)o.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_;
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = (_Storage<unsigned_long,_true>)this_local
  ;
  return (optional<unsigned_long>)
         oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<uint64_t> Lexer::takeOffset() {
  if (auto result = keyword(next())) {
    if (result->span.substr(0, 7) != "offset="sv) {
      return std::nullopt;
    }
    Lexer subLexer(result->span.substr(7));
    if (auto o = subLexer.takeU64()) {
      pos += result->span.size();
      advance();
      return o;
    }
  }
  return std::nullopt;
}